

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.cxx
# Opt level: O0

bool __thiscall
cmCTestCoverageCommand::CheckArgumentKeyword(cmCTestCoverageCommand *this,string *arg)

{
  bool bVar1;
  string *arg_local;
  cmCTestCoverageCommand *this_local;
  
  bVar1 = std::operator==(arg,"LABELS");
  if (bVar1) {
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 3;
    this->LabelsMentioned = true;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ =
         cmCTestHandlerCommand::CheckArgumentKeyword(&this->super_cmCTestHandlerCommand,arg);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestCoverageCommand::CheckArgumentKeyword(std::string const& arg)
{
  // Look for arguments specific to this command.
  if(arg == "LABELS")
    {
    this->ArgumentDoing = ArgumentDoingLabels;
    this->LabelsMentioned = true;
    return true;
    }

  // Look for other arguments.
  return this->Superclass::CheckArgumentKeyword(arg);
}